

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O0

uint32_t * Hacl_Bignum256_32_new_bn_from_bytes_be(uint32_t len,uint8_t *b)

{
  long lVar1;
  uint32_t *__src;
  uint32_t __bsx;
  ulong uVar2;
  undefined1 *__dest;
  uint8_t *b_00;
  undefined8 uStack_80;
  undefined1 auStack_78 [8];
  undefined1 *local_70;
  __uint32_t local_68;
  __uint32_t local_64;
  uint32_t x;
  uint32_t u;
  uint32_t *os;
  ulong uStack_50;
  uint32_t i;
  unsigned_long __vla_expr0;
  uint local_40;
  uint local_3c;
  uint32_t tmpLen;
  uint32_t bnLen;
  uint32_t *res2;
  uint32_t *res1;
  uint32_t *res;
  uint8_t *b_local;
  uint32_t *puStack_10;
  uint32_t len_local;
  
  if ((len == 0) || (0x3fffffff < (len - 1 >> 2) + 1)) {
    puStack_10 = (uint32_t *)0x0;
  }
  else {
    res = (uint32_t *)b;
    b_local._4_4_ = len;
    if (0x3fffffffffffffff < (ulong)((len - 1 >> 2) + 1)) {
      uStack_80 = 0x1d12ce;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum256_32.c"
             ,0x509);
      uStack_80 = 0x1d12d8;
      exit(0xfd);
    }
    uStack_80 = 0x1d12f4;
    _tmpLen = (uint32_t *)calloc((ulong)((len - 1 >> 2) + 1),4);
    puStack_10 = _tmpLen;
    if (_tmpLen != (uint32_t *)0x0) {
      local_3c = (b_local._4_4_ - 1 >> 2) + 1;
      local_40 = local_3c * 4;
      uStack_50 = (ulong)local_40;
      lVar1 = -(uStack_50 + 0xf & 0xfffffffffffffff0);
      uVar2 = (ulong)local_40;
      local_70 = auStack_78 + lVar1;
      __vla_expr0 = (unsigned_long)auStack_78;
      res2 = _tmpLen;
      res1 = _tmpLen;
      *(undefined8 *)(auStack_78 + lVar1 + -8) = 0x1d1399;
      memset(auStack_78 + lVar1,0,uVar2);
      __src = res;
      __dest = local_70 + ((ulong)local_40 - (ulong)b_local._4_4_);
      uVar2 = (ulong)b_local._4_4_;
      *(undefined8 *)(auStack_78 + lVar1 + -8) = 0x1d13c2;
      memcpy(__dest,__src,uVar2);
      for (os._4_4_ = 0; os._4_4_ < local_3c; os._4_4_ = os._4_4_ + 1) {
        _x = _tmpLen;
        b_00 = local_70 + ((local_3c - os._4_4_) + -1) * 4;
        *(undefined8 *)(auStack_78 + lVar1 + -8) = 0x1d13f3;
        __bsx = load32(b_00);
        *(undefined8 *)(auStack_78 + lVar1 + -8) = 0x1d13fa;
        local_68 = __bswap_32(__bsx);
        _x[os._4_4_] = local_68;
        local_64 = local_68;
      }
      puStack_10 = _tmpLen;
    }
  }
  return puStack_10;
}

Assistant:

uint32_t *Hacl_Bignum256_32_new_bn_from_bytes_be(uint32_t len, uint8_t *b)
{
  if (len == 0U || !((len - 1U) / 4U + 1U <= 1073741823U))
  {
    return NULL;
  }
  KRML_CHECK_SIZE(sizeof (uint32_t), (len - 1U) / 4U + 1U);
  uint32_t *res = (uint32_t *)KRML_HOST_CALLOC((len - 1U) / 4U + 1U, sizeof (uint32_t));
  if (res == NULL)
  {
    return res;
  }
  uint32_t *res1 = res;
  uint32_t *res2 = res1;
  uint32_t bnLen = (len - 1U) / 4U + 1U;
  uint32_t tmpLen = 4U * bnLen;
  KRML_CHECK_SIZE(sizeof (uint8_t), tmpLen);
  uint8_t tmp[tmpLen];
  memset(tmp, 0U, tmpLen * sizeof (uint8_t));
  memcpy(tmp + tmpLen - len, b, len * sizeof (uint8_t));
  for (uint32_t i = 0U; i < bnLen; i++)
  {
    uint32_t *os = res2;
    uint32_t u = load32_be(tmp + (bnLen - i - 1U) * 4U);
    uint32_t x = u;
    os[i] = x;
  }
  return res2;
}